

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void xercesc_4_0::XMLUri::normalizeURI(XMLCh *systemURI,XMLBuffer *normalizedURI)

{
  XMLCh toAppend;
  
  normalizedURI->fIndex = 0;
  do {
    while( true ) {
      toAppend = *systemURI;
      if (toAppend == L'%') break;
      if (toAppend == L'\0') {
        return;
      }
LAB_0026b814:
      XMLBuffer::append(normalizedURI,toAppend);
      systemURI = systemURI + 1;
    }
    if ((systemURI[1] != L'2') || (systemURI[2] != L'0')) goto LAB_0026b814;
    systemURI = systemURI + 3;
    XMLBuffer::append(normalizedURI,L' ');
  } while( true );
}

Assistant:

void XMLUri::normalizeURI(const XMLCh*     const systemURI,
                                XMLBuffer&       normalizedURI)
{
    const XMLCh* pszSrc = systemURI;

    normalizedURI.reset();

    while (*pszSrc) {

        if ((*(pszSrc) == chPercent)
        &&  (*(pszSrc+1) == chDigit_2)
        &&  (*(pszSrc+2) == chDigit_0))
        {
            pszSrc += 3;
            normalizedURI.append(chSpace);
        }
        else
        {
            normalizedURI.append(*pszSrc);
            pszSrc++;
        }
    }
}